

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int CVodeSVtolerances(void *cvode_mem,realtype reltol,N_Vector abstol)

{
  N_Vector p_Var1;
  long in_RSI;
  CVodeMem in_RDI;
  double in_XMM0_Qa;
  N_Vector w;
  realtype atolmin;
  CVodeMem cv_mem;
  N_Vector in_stack_ffffffffffffffc8;
  N_Vector in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSVtolerances","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_MallocDone == 0) {
    cvProcessError(in_RDI,-0x17,"CVODE","CVodeSVtolerances","Attempt to call before CVodeInit.");
    local_4 = -0x17;
  }
  else if (0.0 <= in_XMM0_Qa) {
    if (*(long *)(*(long *)(in_RSI + 8) + 0xb0) == 0) {
      cvProcessError(in_RDI,-0x16,"CVODE","CVodeSVtolerances","Missing N_VMin routine from N_Vector"
                    );
      local_4 = -0x16;
    }
    else {
      w = (N_Vector)N_VMin(in_stack_ffffffffffffffd0);
      if (0.0 <= (double)w) {
        if (in_RDI->cv_VabstolMallocDone == 0) {
          p_Var1 = N_VClone(w);
          in_RDI->cv_Vabstol = p_Var1;
          in_RDI->cv_lrw = (long)in_RDI->cv_lrw1 + in_RDI->cv_lrw;
          in_RDI->cv_liw = (long)in_RDI->cv_liw1 + in_RDI->cv_liw;
          in_RDI->cv_VabstolMallocDone = 1;
        }
        in_RDI->cv_reltol = in_XMM0_Qa;
        N_VScale((realtype)w,in_stack_ffffffffffffffc8,(N_Vector)0xeecf6e);
        in_RDI->cv_atolmin0 = (uint)((double)w == 0.0);
        in_RDI->cv_itol = 2;
        in_RDI->cv_user_efun = 0;
        in_RDI->cv_efun = cvEwtSet;
        in_RDI->cv_e_data = (void *)0x0;
        local_4 = 0;
      }
      else {
        cvProcessError(in_RDI,-0x16,"CVODE","CVodeSVtolerances",
                       "abstol has negative component(s) (illegal).");
        local_4 = -0x16;
      }
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,"CVODE","CVodeSVtolerances","reltol < 0 illegal.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSVtolerances(void *cvode_mem, realtype reltol, N_Vector abstol)
{
  CVodeMem cv_mem;
  realtype atolmin;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSVtolerances",
                   MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  if (cv_mem->cv_MallocDone == SUNFALSE) {
    cvProcessError(cv_mem, CV_NO_MALLOC, "CVODE", "CVodeSVtolerances",
                   MSGCV_NO_MALLOC);
    return(CV_NO_MALLOC);
  }

  /* Check inputs */

  if (reltol < ZERO) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSVtolerances",
                   MSGCV_BAD_RELTOL);
    return(CV_ILL_INPUT);
  }

  if (abstol->ops->nvmin == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSVtolerances",
                   "Missing N_VMin routine from N_Vector");
    return(CV_ILL_INPUT);
  }
  atolmin = N_VMin(abstol);
  if (atolmin < ZERO) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSVtolerances",
                   MSGCV_BAD_ABSTOL);
    return(CV_ILL_INPUT);
  }

  /* Copy tolerances into memory */

  if ( !(cv_mem->cv_VabstolMallocDone) ) {
    cv_mem->cv_Vabstol = N_VClone(cv_mem->cv_ewt);
    cv_mem->cv_lrw += cv_mem->cv_lrw1;
    cv_mem->cv_liw += cv_mem->cv_liw1;
    cv_mem->cv_VabstolMallocDone = SUNTRUE;
  }

  cv_mem->cv_reltol = reltol;
  N_VScale(ONE, abstol, cv_mem->cv_Vabstol);
  cv_mem->cv_atolmin0 = (atolmin == ZERO);

  cv_mem->cv_itol = CV_SV;

  cv_mem->cv_user_efun = SUNFALSE;
  cv_mem->cv_efun = cvEwtSet;
  cv_mem->cv_e_data = NULL; /* will be set to cvode_mem in InitialSetup */

  return(CV_SUCCESS);
}